

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void phosg::write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
               (char (*type) [5],void *data,be_uint32_t size,anon_class_8_1_6971b95b *writer)

{
  anon_class_8_1_6971b95b *this;
  uint uVar1;
  uint uVar2;
  reverse_endian<unsigned_int,_unsigned_int> local_30;
  big_endian<unsigned_int,_unsigned_int> local_2c;
  anon_class_8_1_6971b95b *paStack_28;
  be_uint32_t crc;
  anon_class_8_1_6971b95b *writer_local;
  void *data_local;
  char (*type_local) [5];
  be_uint32_t size_local;
  
  paStack_28 = writer;
  type_local._4_4_ =
       (converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
        )(converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
          )size.super_reverse_endian<unsigned_int,_unsigned_int>.
           super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
           .value;
  Image::save::anon_class_8_1_6971b95b::operator()(writer,(void *)((long)&type_local + 4),4);
  Image::save::anon_class_8_1_6971b95b::operator()(paStack_28,type,4);
  uVar1 = converted_endian::operator_cast_to_unsigned_int
                    ((converted_endian *)((long)&type_local + 4));
  this = paStack_28;
  if (uVar1 != 0) {
    uVar1 = converted_endian::operator_cast_to_unsigned_int
                      ((converted_endian *)((long)&type_local + 4));
    Image::save::anon_class_8_1_6971b95b::operator()(this,data,(ulong)uVar1);
  }
  uVar1 = crc32(0,type,4);
  big_endian<unsigned_int,_unsigned_int>::converted_endian(&local_2c,uVar1);
  uVar1 = converted_endian::operator_cast_to_unsigned_int
                    ((converted_endian *)((long)&type_local + 4));
  if (uVar1 != 0) {
    uVar1 = converted_endian::operator_cast_to_unsigned_int((converted_endian *)&local_2c);
    uVar2 = converted_endian::operator_cast_to_unsigned_int
                      ((converted_endian *)((long)&type_local + 4));
    uVar1 = crc32(uVar1,data,uVar2);
    big_endian<unsigned_int,_unsigned_int>::converted_endian
              ((big_endian<unsigned_int,_unsigned_int> *)&local_30,uVar1);
    local_2c.super_reverse_endian<unsigned_int,_unsigned_int>.
    super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
    .value = (reverse_endian<unsigned_int,_unsigned_int>)
             (reverse_endian<unsigned_int,_unsigned_int>)
             local_30.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
             .value;
  }
  Image::save::anon_class_8_1_6971b95b::operator()(paStack_28,&local_2c,4);
  return;
}

Assistant:

static void write_png_chunk(const char (&type)[5],
    const void* data, be_uint32_t size,
    Writer&& writer) {

  writer(&size, 4);
  writer(type, 4);
  if (size > 0) {
    writer(data, size);
  }

  // The CRC includes the chunk type, but not the length
  // The CRC of the (empty) IEND chunk is big-endian 0xAE426082
  be_uint32_t crc = crc32(0u, reinterpret_cast<const Bytef*>(type), 4);
  if (size > 0) {
    crc = crc32(crc, static_cast<const Bytef*>(data), size);
  }
  writer(&crc, 4);
}